

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alconfig.cpp
# Opt level: O2

char * GetConfigValue(char *devName,char *blockName,char *keyName,char *def)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  __type _Var2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  long lVar6;
  string key;
  
  if (keyName == (char *)0x0) {
    return def;
  }
  key._M_dataplus._M_p = (pointer)&key.field_2;
  key._M_string_length = 0;
  key.field_2._M_local_buf[0] = '\0';
  if ((blockName == (char *)0x0) || (iVar3 = al::strcasecmp(blockName,"general"), iVar3 == 0)) {
    if (devName != (char *)0x0) {
      std::__cxx11::string::assign((char *)&key);
      goto LAB_00137987;
    }
  }
  else {
    std::__cxx11::string::assign((char *)&key);
    if (devName != (char *)0x0) {
      std::__cxx11::string::push_back((char)&key);
      std::__cxx11::string::append((char *)&key);
    }
LAB_00137987:
    std::__cxx11::string::push_back((char)&key);
  }
  std::__cxx11::string::append((char *)&key);
  pbVar1 = DAT_001adff8;
  lVar6 = (long)DAT_001adff8 - (long)(anonymous_namespace)::ConfOpts;
  __lhs = (anonymous_namespace)::ConfOpts;
  for (lVar5 = lVar6 >> 8; pbVar4 = __lhs, 0 < lVar5; lVar5 = lVar5 + -1) {
    _Var2 = std::operator==(__lhs,&key);
    if (_Var2) goto LAB_00137abc;
    _Var2 = std::operator==(__lhs + 2,&key);
    pbVar4 = __lhs + 2;
    if (_Var2) goto LAB_00137abc;
    _Var2 = std::operator==(__lhs + 4,&key);
    pbVar4 = __lhs + 4;
    if (_Var2) goto LAB_00137abc;
    _Var2 = std::operator==(__lhs + 6,&key);
    pbVar4 = __lhs + 6;
    if (_Var2) goto LAB_00137abc;
    __lhs = __lhs + 8;
    lVar6 = lVar6 + -0x100;
  }
  lVar6 = lVar6 >> 6;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      pbVar4 = pbVar1;
      if ((lVar6 != 3) || (_Var2 = std::operator==(__lhs,&key), pbVar4 = __lhs, _Var2))
      goto LAB_00137abc;
      pbVar4 = __lhs + 2;
    }
    _Var2 = std::operator==(pbVar4,&key);
    if (_Var2) goto LAB_00137abc;
    __lhs = pbVar4 + 2;
  }
  _Var2 = std::operator==(__lhs,&key);
  pbVar4 = pbVar1;
  if (_Var2) {
    pbVar4 = __lhs;
  }
LAB_00137abc:
  if (pbVar4 == DAT_001adff8) {
    if (devName == (char *)0x0) {
      if (2 < (int)gLogLevel) {
        fprintf((FILE *)gLogFile,"[ALSOFT] (II) Key %s not found\n",key._M_dataplus._M_p);
      }
    }
    else {
      def = GetConfigValue((char *)0x0,blockName,keyName,def);
    }
  }
  else {
    if (2 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (II) Found %s = \"%s\"\n",key._M_dataplus._M_p,
              pbVar4[1]._M_dataplus._M_p);
    }
    if (pbVar4[1]._M_string_length != 0) {
      def = pbVar4[1]._M_dataplus._M_p;
    }
  }
  std::__cxx11::string::~string((string *)&key);
  return def;
}

Assistant:

const char *GetConfigValue(const char *devName, const char *blockName, const char *keyName, const char *def)
{
    if(!keyName)
        return def;

    std::string key;
    if(blockName && al::strcasecmp(blockName, "general") != 0)
    {
        key = blockName;
        if(devName)
        {
            key += '/';
            key += devName;
        }
        key += '/';
        key += keyName;
    }
    else
    {
        if(devName)
        {
            key = devName;
            key += '/';
        }
        key += keyName;
    }

    auto iter = std::find_if(ConfOpts.cbegin(), ConfOpts.cend(),
        [&key](const ConfigEntry &entry) -> bool
        { return entry.key == key; }
    );
    if(iter != ConfOpts.cend())
    {
        TRACE("Found %s = \"%s\"\n", key.c_str(), iter->value.c_str());
        if(!iter->value.empty())
            return iter->value.c_str();
        return def;
    }

    if(!devName)
    {
        TRACE("Key %s not found\n", key.c_str());
        return def;
    }
    return GetConfigValue(nullptr, blockName, keyName, def);
}